

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtt.c
# Opt level: O0

vtt_block_t * vtt_block_new(vtt_t *vtt,utf8_char_t *data,size_t size,VTT_BLOCK_TYPE type)

{
  vtt_block_t *block_00;
  utf8_char_t *__s;
  VTT_BLOCK_TYPE in_ECX;
  size_t in_RDX;
  void *in_RSI;
  long *in_RDI;
  utf8_char_t *dest;
  vtt_block_t *block;
  
  block_00 = (vtt_block_t *)malloc(in_RDX + 0x41);
  block_00->next = (_vtt_block_t *)0x0;
  block_00->type = in_ECX;
  block_00->timestamp = 0.0;
  block_00->duration = 0.0;
  block_00->cue_settings = (char *)0x0;
  block_00->cue_id = (char *)0x0;
  block_00->text_size = in_RDX;
  switch(in_ECX) {
  case VTT_REGION:
    if (*in_RDI == 0) {
      *in_RDI = (long)block_00;
    }
    else {
      *(vtt_block_t **)in_RDI[1] = block_00;
    }
    in_RDI[1] = (long)block_00;
    break;
  case VTT_STYLE:
    if (in_RDI[2] == 0) {
      in_RDI[2] = (long)block_00;
    }
    else {
      *(vtt_block_t **)in_RDI[3] = block_00;
    }
    in_RDI[3] = (long)block_00;
    break;
  case VTT_NOTE:
    break;
  case VTT_CUE:
    if (in_RDI[4] == 0) {
      in_RDI[4] = (long)block_00;
    }
    else {
      *(vtt_block_t **)in_RDI[5] = block_00;
    }
    in_RDI[5] = (long)block_00;
  }
  __s = vtt_block_data(block_00);
  if (in_RSI == (void *)0x0) {
    memset(__s,0,in_RDX);
  }
  else {
    memcpy(__s,in_RSI,in_RDX);
  }
  __s[in_RDX] = '\0';
  return block_00;
}

Assistant:

vtt_block_t* vtt_block_new(vtt_t* vtt, const utf8_char_t* data, size_t size, enum VTT_BLOCK_TYPE type)
{
    vtt_block_t* block = malloc(sizeof(vtt_block_t) + size + 1);
    block->next = NULL;
    block->type = type;
    block->timestamp = 0.0;
    block->duration = 0.0;
    block->cue_settings = NULL;
    block->cue_id = NULL;
    block->text_size = size;

    switch (type) {
    case VTT_REGION:
        if (vtt->region_head == NULL) {
            vtt->region_head = block;
        } else {
            vtt->region_tail->next = block;
        }
        vtt->region_tail = block;
        break;
    case VTT_STYLE:
        if (vtt->style_head == NULL) {
            vtt->style_head = block;
        } else {
            vtt->style_tail->next = block;
        }
        vtt->style_tail = block;
        break;
    case VTT_CUE:
        if (vtt->cue_head == NULL) {
            vtt->cue_head = block;
        } else {
            vtt->cue_tail->next = block;
        }
        vtt->cue_tail = block;
        break;
    case VTT_NOTE:
        break;
    }

    utf8_char_t* dest = (utf8_char_t*)vtt_block_data(block);
    if (data) {
        memcpy(dest, data, size);
    } else {
        memset(dest, 0, size);
    }

    dest[size] = '\0';
    return block;
}